

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O0

int apply_patch(cJSON *object,cJSON *patch,cJSON_bool case_sensitive)

{
  int iVar1;
  patch_operation pVar2;
  cJSON_bool cVar3;
  cJSON *pcVar4;
  cJSON *pcVar5;
  long in_FS_OFFSET;
  cJSON *from;
  cJSON *old_item;
  uchar *puStack_60;
  int status;
  uchar *child_pointer;
  uchar *parent_pointer;
  patch_operation opcode;
  cJSON *parent;
  cJSON *value;
  cJSON *path;
  cJSON_bool case_sensitive_local;
  cJSON *patch_local;
  cJSON *object_local;
  size_t index;
  
  index = *(size_t *)(in_FS_OFFSET + 0x28);
  parent = (cJSON *)0x0;
  child_pointer = (uchar *)0x0;
  puStack_60 = (uchar *)0x0;
  old_item._4_4_ = 0;
  pcVar4 = get_object_item(patch,"path",case_sensitive);
  iVar1 = cJSON_IsString(pcVar4);
  if (iVar1 == 0) {
    old_item._4_4_ = 2;
  }
  else {
    pVar2 = decode_patch_operation(patch,case_sensitive);
    if (pVar2 == INVALID) {
      old_item._4_4_ = 3;
    }
    else if (pVar2 == TEST) {
      pcVar4 = get_item_from_pointer(object,pcVar4->valuestring,case_sensitive);
      pcVar5 = get_object_item(patch,"value",case_sensitive);
      cVar3 = compare_json(pcVar4,pcVar5,case_sensitive);
      old_item._4_4_ = (uint)((cVar3 != 0 ^ 0xffU) & 1);
    }
    else {
      if (*pcVar4->valuestring == '\0') {
        if (pVar2 == REMOVE) {
          overwrite_item(object,(cJSON)ZEXT1664(ZEXT816(0)));
          old_item._4_4_ = 0;
          goto LAB_00101d8f;
        }
        if ((pVar2 == REPLACE) || (pVar2 == ADD)) {
          pcVar4 = get_object_item(patch,"value",case_sensitive);
          if (pcVar4 == (cJSON *)0x0) {
            old_item._4_4_ = 7;
            parent = (cJSON *)0x0;
          }
          else {
            pcVar4 = (cJSON *)cJSON_Duplicate(pcVar4,1);
            if (pcVar4 == (cJSON *)0x0) {
              old_item._4_4_ = 8;
              parent = (cJSON *)0x0;
            }
            else {
              overwrite_item(object,*pcVar4);
              cJSON_free(pcVar4);
              parent = (cJSON *)0x0;
              if (object->string != (char *)0x0) {
                cJSON_free(object->string);
                object->string = (char *)0x0;
              }
              old_item._4_4_ = 0;
            }
          }
          goto LAB_00101d8f;
        }
      }
      if ((pVar2 == REMOVE) || (pVar2 == REPLACE)) {
        pcVar5 = detach_path(object,(uchar *)pcVar4->valuestring,case_sensitive);
        if (pcVar5 == (cJSON *)0x0) {
          old_item._4_4_ = 0xd;
          goto LAB_00101d8f;
        }
        cJSON_Delete(pcVar5);
        if (pVar2 == REMOVE) {
          old_item._4_4_ = 0;
          goto LAB_00101d8f;
        }
      }
      if ((pVar2 == MOVE) || (pVar2 == COPY)) {
        pcVar5 = get_object_item(patch,"from",case_sensitive);
        if (pcVar5 == (cJSON *)0x0) {
          old_item._4_4_ = 4;
          goto LAB_00101d8f;
        }
        if (pVar2 == MOVE) {
          parent = detach_path(object,(uchar *)pcVar5->valuestring,case_sensitive);
        }
        if (pVar2 == COPY) {
          parent = get_item_from_pointer(object,pcVar5->valuestring,case_sensitive);
        }
        if (parent == (cJSON *)0x0) {
          old_item._4_4_ = 5;
          goto LAB_00101d8f;
        }
        if (pVar2 == COPY) {
          parent = (cJSON *)cJSON_Duplicate(parent,1);
        }
        if (parent == (cJSON *)0x0) {
          old_item._4_4_ = 6;
          goto LAB_00101d8f;
        }
      }
      else {
        pcVar5 = get_object_item(patch,"value",case_sensitive);
        if (pcVar5 == (cJSON *)0x0) {
          old_item._4_4_ = 7;
          parent = (cJSON *)0x0;
          goto LAB_00101d8f;
        }
        parent = (cJSON *)cJSON_Duplicate(pcVar5,1);
        if (parent == (cJSON *)0x0) {
          old_item._4_4_ = 8;
          goto LAB_00101d8f;
        }
      }
      child_pointer = cJSONUtils_strdup((uchar *)pcVar4->valuestring);
      if (child_pointer != (uchar *)0x0) {
        puStack_60 = (uchar *)strrchr((char *)child_pointer,0x2f);
      }
      if (puStack_60 != (uchar *)0x0) {
        *puStack_60 = '\0';
        puStack_60 = puStack_60 + 1;
      }
      pcVar4 = get_item_from_pointer(object,(char *)child_pointer,case_sensitive);
      decode_pointer_inplace(puStack_60);
      if ((pcVar4 == (cJSON *)0x0) || (puStack_60 == (uchar *)0x0)) {
        old_item._4_4_ = 9;
      }
      else {
        iVar1 = cJSON_IsArray(pcVar4);
        if (iVar1 == 0) {
          iVar1 = cJSON_IsObject(pcVar4);
          if (iVar1 == 0) {
            old_item._4_4_ = 9;
            goto LAB_00101d8f;
          }
          if (case_sensitive == 0) {
            cJSON_DeleteItemFromObject(pcVar4,puStack_60);
          }
          else {
            cJSON_DeleteItemFromObjectCaseSensitive(pcVar4,puStack_60);
          }
          cJSON_AddItemToObject(pcVar4,puStack_60,parent);
        }
        else {
          iVar1 = strcmp((char *)puStack_60,"-");
          if (iVar1 == 0) {
            cJSON_AddItemToArray(pcVar4,parent);
          }
          else {
            object_local = (cJSON *)0x0;
            cVar3 = decode_array_index_from_pointer(puStack_60,(size_t *)&object_local);
            if (cVar3 == 0) {
              old_item._4_4_ = 0xb;
              goto LAB_00101d8f;
            }
            cVar3 = insert_item_in_array(pcVar4,(size_t)object_local,parent);
            if (cVar3 == 0) {
              old_item._4_4_ = 10;
              goto LAB_00101d8f;
            }
          }
        }
        parent = (cJSON *)0x0;
      }
    }
  }
LAB_00101d8f:
  if (parent != (cJSON *)0x0) {
    cJSON_Delete(parent);
  }
  if (child_pointer != (uchar *)0x0) {
    cJSON_free(child_pointer);
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != index) {
    __stack_chk_fail();
  }
  return old_item._4_4_;
}

Assistant:

static int apply_patch(cJSON *object, const cJSON *patch, const cJSON_bool case_sensitive)
{
    cJSON *path = NULL;
    cJSON *value = NULL;
    cJSON *parent = NULL;
    enum patch_operation opcode = INVALID;
    unsigned char *parent_pointer = NULL;
    unsigned char *child_pointer = NULL;
    int status = 0;

    path = get_object_item(patch, "path", case_sensitive);
    if (!cJSON_IsString(path))
    {
        /* malformed patch. */
        status = 2;
        goto cleanup;
    }

    opcode = decode_patch_operation(patch, case_sensitive);
    if (opcode == INVALID)
    {
        status = 3;
        goto cleanup;
    }
    else if (opcode == TEST)
    {
        /* compare value: {...} with the given path */
        status = !compare_json(get_item_from_pointer(object, path->valuestring, case_sensitive), get_object_item(patch, "value", case_sensitive), case_sensitive);
        goto cleanup;
    }

    /* special case for replacing the root */
    if (path->valuestring[0] == '\0')
    {
        if (opcode == REMOVE)
        {
            static const cJSON invalid = { NULL, NULL, NULL, cJSON_Invalid, NULL, 0, 0, NULL};

            overwrite_item(object, invalid);

            status = 0;
            goto cleanup;
        }

        if ((opcode == REPLACE) || (opcode == ADD))
        {
            value = get_object_item(patch, "value", case_sensitive);
            if (value == NULL)
            {
                /* missing "value" for add/replace. */
                status = 7;
                goto cleanup;
            }

            value = cJSON_Duplicate(value, 1);
            if (value == NULL)
            {
                /* out of memory for add/replace. */
                status = 8;
                goto cleanup;
            }

            overwrite_item(object, *value);

            /* delete the duplicated value */
            cJSON_free(value);
            value = NULL;

            /* the string "value" isn't needed */
            if (object->string != NULL)
            {
                cJSON_free(object->string);
                object->string = NULL;
            }

            status = 0;
            goto cleanup;
        }
    }

    if ((opcode == REMOVE) || (opcode == REPLACE))
    {
        /* Get rid of old. */
        cJSON *old_item = detach_path(object, (unsigned char*)path->valuestring, case_sensitive);
        if (old_item == NULL)
        {
            status = 13;
            goto cleanup;
        }
        cJSON_Delete(old_item);
        if (opcode == REMOVE)
        {
            /* For Remove, this job is done. */
            status = 0;
            goto cleanup;
        }
    }

    /* Copy/Move uses "from". */
    if ((opcode == MOVE) || (opcode == COPY))
    {
        cJSON *from = get_object_item(patch, "from", case_sensitive);
        if (from == NULL)
        {
            /* missing "from" for copy/move. */
            status = 4;
            goto cleanup;
        }

        if (opcode == MOVE)
        {
            value = detach_path(object, (unsigned char*)from->valuestring, case_sensitive);
        }
        if (opcode == COPY)
        {
            value = get_item_from_pointer(object, from->valuestring, case_sensitive);
        }
        if (value == NULL)
        {
            /* missing "from" for copy/move. */
            status = 5;
            goto cleanup;
        }
        if (opcode == COPY)
        {
            value = cJSON_Duplicate(value, 1);
        }
        if (value == NULL)
        {
            /* out of memory for copy/move. */
            status = 6;
            goto cleanup;
        }
    }
    else /* Add/Replace uses "value". */
    {
        value = get_object_item(patch, "value", case_sensitive);
        if (value == NULL)
        {
            /* missing "value" for add/replace. */
            status = 7;
            goto cleanup;
        }
        value = cJSON_Duplicate(value, 1);
        if (value == NULL)
        {
            /* out of memory for add/replace. */
            status = 8;
            goto cleanup;
        }
    }

    /* Now, just add "value" to "path". */

    /* split pointer in parent and child */
    parent_pointer = cJSONUtils_strdup((unsigned char*)path->valuestring);
    if (parent_pointer) {
        child_pointer = (unsigned char*)strrchr((char*)parent_pointer, '/');
    }
    if (child_pointer != NULL)
    {
        child_pointer[0] = '\0';
        child_pointer++;
    }
    parent = get_item_from_pointer(object, (char*)parent_pointer, case_sensitive);
    decode_pointer_inplace(child_pointer);

    /* add, remove, replace, move, copy, test. */
    if ((parent == NULL) || (child_pointer == NULL))
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }
    else if (cJSON_IsArray(parent))
    {
        if (strcmp((char*)child_pointer, "-") == 0)
        {
            cJSON_AddItemToArray(parent, value);
            value = NULL;
        }
        else
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer(child_pointer, &index))
            {
                status = 11;
                goto cleanup;
            }

            if (!insert_item_in_array(parent, index, value))
            {
                status = 10;
                goto cleanup;
            }
            value = NULL;
        }
    }
    else if (cJSON_IsObject(parent))
    {
        if (case_sensitive)
        {
            cJSON_DeleteItemFromObjectCaseSensitive(parent, (char*)child_pointer);
        }
        else
        {
            cJSON_DeleteItemFromObject(parent, (char*)child_pointer);
        }
        cJSON_AddItemToObject(parent, (char*)child_pointer, value);
        value = NULL;
    }
    else /* parent is not an object */
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }

cleanup:
    if (value != NULL)
    {
        cJSON_Delete(value);
    }
    if (parent_pointer != NULL)
    {
        cJSON_free(parent_pointer);
    }

    return status;
}